

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Disk.cpp
# Opt level: O2

ssize_t __thiscall Disk::write(Disk *this,int __fd,void *__buf,size_t __n)

{
  mapped_type *pmVar1;
  undefined4 in_register_00000034;
  CylHead cylhead;
  CylHead local_20;
  
  (this->fmt).sectors = 0;
  std::mutex::lock(&this->m_trackdata_mutex);
  local_20 = ((TrackData *)CONCAT44(in_register_00000034,__fd))->cylhead;
  pmVar1 = std::
           map<CylHead,_TrackData,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_TrackData>_>_>
           ::operator[](&this->m_trackdata,&local_20);
  TrackData::operator=(pmVar1,(TrackData *)CONCAT44(in_register_00000034,__fd));
  pmVar1 = std::
           map<CylHead,_TrackData,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_TrackData>_>_>
           ::operator[](&this->m_trackdata,&local_20);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_trackdata_mutex);
  return (ssize_t)pmVar1;
}

Assistant:

const TrackData& Disk::write(TrackData&& trackdata)
{
    // Invalidate stored format, since we can no longer guarantee a match
    fmt.sectors = 0;

    std::lock_guard<std::mutex> lock(m_trackdata_mutex);
    auto cylhead = trackdata.cylhead;
    m_trackdata[cylhead] = std::move(trackdata);
    return m_trackdata[cylhead];
}